

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqastparser.cpp
# Opt level: O0

Expr * __thiscall SQCompilation::SQParser::Factor(SQParser *this,SQInteger *pos)

{
  long lVar1;
  bool bVar2;
  bool bVar3;
  SQInteger SVar4;
  SQInteger SVar5;
  LiteralExpr *to;
  SQParser *in_RDI;
  Decl *classDecl;
  TableDecl *t;
  Expr *v;
  bool reported;
  bool spaceSeparated;
  bool commaSeparated;
  ArrayExpr *arr;
  SQInteger c;
  SQInteger l;
  Expr *r;
  NestingChecker nc;
  SQParser *in_stack_fffffffffffffd88;
  ArrayExpr *in_stack_fffffffffffffd90;
  TableDecl *in_stack_fffffffffffffd98;
  SQParser *in_stack_fffffffffffffda0;
  TableDecl *in_stack_fffffffffffffda8;
  TreeOp args;
  SQParser *in_stack_fffffffffffffdb0;
  SQInteger in_stack_fffffffffffffdc8;
  SQParser *in_stack_fffffffffffffdd0;
  SQInteger in_stack_fffffffffffffdd8;
  SQParser *in_stack_fffffffffffffde0;
  SQParser *in_stack_fffffffffffffdf0;
  Expr *in_stack_fffffffffffffe08;
  bool bVar6;
  SQParser *in_stack_fffffffffffffe10;
  undefined8 in_stack_fffffffffffffe58;
  SQExpressionContext expression_context;
  SQParser *in_stack_fffffffffffffe60;
  SQInteger in_stack_fffffffffffffee8;
  SQInteger in_stack_fffffffffffffef0;
  TableDecl *in_stack_fffffffffffffef8;
  SQParser *in_stack_ffffffffffffff00;
  SQParser *in_stack_ffffffffffffff18;
  int local_48;
  int local_30;
  SQParser *local_28;
  NestingChecker local_20 [2];
  
  NestingChecker::NestingChecker
            ((NestingChecker *)in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
  local_28 = (SQParser *)0x0;
  SVar4 = line(in_RDI);
  SVar5 = column(in_RDI);
  expression_context = (SQExpressionContext)((ulong)in_stack_fffffffffffffe58 >> 0x20);
  lVar1 = in_RDI->_token;
  if (lVar1 == 0x21) {
    Lex(in_stack_fffffffffffffda0);
    UnaryOP(in_stack_fffffffffffffdd0,(TreeOp)((ulong)in_stack_fffffffffffffdc8 >> 0x20));
    local_28 = (SQParser *)
               setCoordinates<SQCompilation::Expr>
                         (in_stack_fffffffffffffda0,(Expr *)in_stack_fffffffffffffd98,
                          (SQInteger)in_stack_fffffffffffffd90,(SQInteger)in_stack_fffffffffffffd88)
    ;
  }
  else if (lVar1 == 0x28) {
    Lex(in_stack_fffffffffffffda0);
    args = (TreeOp)((ulong)in_stack_fffffffffffffda8 >> 0x20);
    Expression(in_stack_fffffffffffffe60,expression_context);
    newNode<SQCompilation::UnExpr,TreeOp,SQCompilation::Expr*>
              (in_stack_fffffffffffffdb0,args,(Expr *)in_stack_fffffffffffffda0);
    local_28 = (SQParser *)
               setCoordinates<SQCompilation::UnExpr>
                         (in_stack_fffffffffffffda0,(UnExpr *)in_stack_fffffffffffffd98,
                          (SQInteger)in_stack_fffffffffffffd90,(SQInteger)in_stack_fffffffffffffd88)
    ;
    Expect(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
  }
  else if (lVar1 == 0x2d) {
    Lex(in_stack_fffffffffffffda0);
    if (in_RDI->_token == 0x104) {
      newNode<SQCompilation::LiteralExpr,long>
                (in_stack_fffffffffffffdb0,(long)in_stack_fffffffffffffda8);
      local_28 = (SQParser *)
                 setCoordinates<SQCompilation::LiteralExpr>
                           (in_stack_fffffffffffffda0,(LiteralExpr *)in_stack_fffffffffffffd98,
                            (SQInteger)in_stack_fffffffffffffd90,
                            (SQInteger)in_stack_fffffffffffffd88);
      Lex(in_stack_fffffffffffffda0);
    }
    else if (in_RDI->_token == 0x105) {
      newNode<SQCompilation::LiteralExpr,float>
                (in_stack_fffffffffffffdb0,(float)((ulong)in_stack_fffffffffffffda8 >> 0x20));
      local_28 = (SQParser *)
                 setCoordinates<SQCompilation::LiteralExpr>
                           (in_stack_fffffffffffffda0,(LiteralExpr *)in_stack_fffffffffffffd98,
                            (SQInteger)in_stack_fffffffffffffd90,
                            (SQInteger)in_stack_fffffffffffffd88);
      Lex(in_stack_fffffffffffffda0);
    }
    else {
      UnaryOP(in_stack_fffffffffffffdd0,(TreeOp)((ulong)in_stack_fffffffffffffdc8 >> 0x20));
      local_28 = (SQParser *)
                 setCoordinates<SQCompilation::Expr>
                           (in_stack_fffffffffffffda0,(Expr *)in_stack_fffffffffffffd98,
                            (SQInteger)in_stack_fffffffffffffd90,
                            (SQInteger)in_stack_fffffffffffffd88);
    }
  }
  else {
    bVar6 = SUB81((ulong)in_stack_fffffffffffffe08 >> 0x38,0);
    if (lVar1 == 0x40) {
      local_28 = (SQParser *)FunctionExp(in_stack_fffffffffffffe10,bVar6);
    }
    else if (lVar1 == 0x5b) {
      Lex(in_stack_fffffffffffffda0);
      arena(in_RDI);
      local_28 = (SQParser *)
                 newNode<SQCompilation::ArrayExpr,Arena*>
                           (in_stack_fffffffffffffdb0,(Arena *)in_stack_fffffffffffffda8);
      bVar6 = false;
      bVar2 = false;
      bVar3 = false;
      while (in_RDI->_token != 0x5d) {
        Expression(in_stack_fffffffffffffe60,
                   (SQExpressionContext)((ulong)in_stack_fffffffffffffe58 >> 0x20));
        ArrayExpr::addValue(in_stack_fffffffffffffd90,(Expr *)in_stack_fffffffffffffd88);
        if (in_RDI->_token == 0x2c) {
          bVar6 = true;
        }
        else if (in_RDI->_token != 0x5d) {
          bVar2 = true;
        }
        if (((bVar6) && (bVar2)) && (!bVar3)) {
          bVar3 = true;
          reportDiagnostic(in_RDI,0x6d,"elements of array");
        }
        if (in_RDI->_token == 0x2c) {
          Lex(in_stack_fffffffffffffda0);
        }
      }
      setCoordinates<SQCompilation::ArrayExpr>
                (in_stack_fffffffffffffda0,(ArrayExpr *)in_stack_fffffffffffffd98,
                 (SQInteger)in_stack_fffffffffffffd90,(SQInteger)in_stack_fffffffffffffd88);
      Lex(in_stack_fffffffffffffda0);
    }
    else if (lVar1 == 0x7b) {
      Lex(in_stack_fffffffffffffda0);
      arena(in_RDI);
      newNode<SQCompilation::TableDecl,Arena*>
                (in_stack_fffffffffffffdb0,(Arena *)in_stack_fffffffffffffda8);
      ParseTableOrClass(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
                        in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
      setCoordinates<SQCompilation::TableDecl>
                (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
                 (SQInteger)in_stack_fffffffffffffd90,(SQInteger)in_stack_fffffffffffffd88);
      newNode<SQCompilation::DeclExpr,SQCompilation::TableDecl*>
                (in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
      local_28 = (SQParser *)
                 setCoordinates<SQCompilation::DeclExpr>
                           (in_stack_fffffffffffffda0,(DeclExpr *)in_stack_fffffffffffffd98,
                            (SQInteger)in_stack_fffffffffffffd90,
                            (SQInteger)in_stack_fffffffffffffd88);
    }
    else if (lVar1 == 0x7e) {
      Lex(in_stack_fffffffffffffda0);
      if (in_RDI->_token == 0x104) {
        newNode<SQCompilation::LiteralExpr,long>
                  (in_stack_fffffffffffffdb0,(long)in_stack_fffffffffffffda8);
        local_28 = (SQParser *)
                   setCoordinates<SQCompilation::LiteralExpr>
                             (in_stack_fffffffffffffda0,(LiteralExpr *)in_stack_fffffffffffffd98,
                              (SQInteger)in_stack_fffffffffffffd90,
                              (SQInteger)in_stack_fffffffffffffd88);
        Lex(in_stack_fffffffffffffda0);
      }
      else {
        UnaryOP(in_stack_fffffffffffffdd0,(TreeOp)((ulong)in_stack_fffffffffffffdc8 >> 0x20));
        local_28 = (SQParser *)
                   setCoordinates<SQCompilation::Expr>
                             (in_stack_fffffffffffffda0,(Expr *)in_stack_fffffffffffffd98,
                              (SQInteger)in_stack_fffffffffffffd90,
                              (SQInteger)in_stack_fffffffffffffd88);
      }
    }
    else {
      local_30 = (int)SVar4;
      local_48 = (int)SVar5;
      if (lVar1 == 0x102) {
        local_28 = (SQParser *)newId(in_stack_fffffffffffffda0,(SQChar *)in_stack_fffffffffffffd98);
        Node::setLineStartPos((Node *)local_28,local_30);
        Node::setColumnStartPos((Node *)local_28,local_48);
        Lex(in_stack_fffffffffffffda0);
      }
      else if (lVar1 == 0x103) {
        local_28 = (SQParser *)
                   newStringLiteral(in_stack_fffffffffffffda0,(SQChar *)in_stack_fffffffffffffd98);
        Node::setLineStartPos((Node *)local_28,local_30);
        Node::setColumnStartPos((Node *)local_28,local_48);
        Lex(in_stack_fffffffffffffda0);
      }
      else if (lVar1 == 0x104) {
        newNode<SQCompilation::LiteralExpr,long>
                  (in_stack_fffffffffffffdb0,(long)in_stack_fffffffffffffda8);
        local_28 = (SQParser *)
                   setCoordinates<SQCompilation::LiteralExpr>
                             (in_stack_fffffffffffffda0,(LiteralExpr *)in_stack_fffffffffffffd98,
                              (SQInteger)in_stack_fffffffffffffd90,
                              (SQInteger)in_stack_fffffffffffffd88);
        Lex(in_stack_fffffffffffffda0);
      }
      else if (lVar1 == 0x105) {
        newNode<SQCompilation::LiteralExpr,float>
                  (in_stack_fffffffffffffdb0,(float)((ulong)in_stack_fffffffffffffda8 >> 0x20));
        local_28 = (SQParser *)
                   setCoordinates<SQCompilation::LiteralExpr>
                             (in_stack_fffffffffffffda0,(LiteralExpr *)in_stack_fffffffffffffd98,
                              (SQInteger)in_stack_fffffffffffffd90,
                              (SQInteger)in_stack_fffffffffffffd88);
        Lex(in_stack_fffffffffffffda0);
      }
      else if (lVar1 == 0x106) {
        newNode<SQCompilation::BaseExpr>(in_stack_fffffffffffffda0);
        local_28 = (SQParser *)
                   setCoordinates<SQCompilation::BaseExpr>
                             (in_stack_fffffffffffffda0,(BaseExpr *)in_stack_fffffffffffffd98,
                              (SQInteger)in_stack_fffffffffffffd90,
                              (SQInteger)in_stack_fffffffffffffd88);
        Lex(in_stack_fffffffffffffda0);
      }
      else if (lVar1 == 0x107) {
        if ((in_RDI->_lang_features & 4) != 0) {
          reportDiagnostic(in_RDI,0x21);
        }
        local_28 = (SQParser *)DeleteExpr(in_stack_fffffffffffffdf0);
      }
      else if (lVar1 == 0x116) {
        newNode<SQCompilation::LiteralExpr>(in_stack_fffffffffffffda0);
        local_28 = (SQParser *)
                   setCoordinates<SQCompilation::LiteralExpr>
                             (in_stack_fffffffffffffda0,(LiteralExpr *)in_stack_fffffffffffffd98,
                              (SQInteger)in_stack_fffffffffffffd90,
                              (SQInteger)in_stack_fffffffffffffd88);
        Lex(in_stack_fffffffffffffda0);
      }
      else if (lVar1 == 0x11c) {
        Lex(in_stack_fffffffffffffda0);
        UnaryOP(in_stack_fffffffffffffdd0,(TreeOp)((ulong)in_stack_fffffffffffffdc8 >> 0x20));
        local_28 = (SQParser *)
                   setCoordinates<SQCompilation::Expr>
                             (in_stack_fffffffffffffda0,(Expr *)in_stack_fffffffffffffd98,
                              (SQInteger)in_stack_fffffffffffffd90,
                              (SQInteger)in_stack_fffffffffffffd88);
      }
      else if (lVar1 == 0x11d) {
        local_28 = (SQParser *)FunctionExp(in_stack_fffffffffffffe10,bVar6);
      }
      else if (lVar1 == 0x11f) {
        Lex(in_stack_fffffffffffffda0);
        UnaryOP(in_stack_fffffffffffffdd0,(TreeOp)((ulong)in_stack_fffffffffffffdc8 >> 0x20));
        local_28 = (SQParser *)
                   setCoordinates<SQCompilation::Expr>
                             (in_stack_fffffffffffffda0,(Expr *)in_stack_fffffffffffffd98,
                              (SQInteger)in_stack_fffffffffffffd90,
                              (SQInteger)in_stack_fffffffffffffd88);
      }
      else if (lVar1 == 0x12a) {
        Lex(in_stack_fffffffffffffda0);
        UnaryOP(in_stack_fffffffffffffdd0,(TreeOp)((ulong)in_stack_fffffffffffffdc8 >> 0x20));
        local_28 = (SQParser *)
                   setCoordinates<SQCompilation::Expr>
                             (in_stack_fffffffffffffda0,(Expr *)in_stack_fffffffffffffd98,
                              (SQInteger)in_stack_fffffffffffffd90,
                              (SQInteger)in_stack_fffffffffffffd88);
      }
      else if (lVar1 == 299) {
        if ((in_RDI->_lang_features & 1) != 0) {
          reportDiagnostic(in_RDI,0x20);
        }
        in_RDI->_token = 0x2e;
        newNode<SQCompilation::RootTableAccessExpr>(in_stack_fffffffffffffda0);
        local_28 = (SQParser *)
                   setCoordinates<SQCompilation::RootTableAccessExpr>
                             (in_stack_fffffffffffffda0,
                              (RootTableAccessExpr *)in_stack_fffffffffffffd98,
                              (SQInteger)in_stack_fffffffffffffd90,
                              (SQInteger)in_stack_fffffffffffffd88);
      }
      else if (lVar1 == 0x12e) {
        newNode<SQCompilation::Id,char_const*>
                  (in_stack_fffffffffffffdb0,(char *)in_stack_fffffffffffffda8);
        local_28 = (SQParser *)
                   setCoordinates<SQCompilation::Id>
                             (in_stack_fffffffffffffda0,(Id *)in_stack_fffffffffffffd98,
                              (SQInteger)in_stack_fffffffffffffd90,
                              (SQInteger)in_stack_fffffffffffffd88);
        Lex(in_stack_fffffffffffffda0);
      }
      else if (lVar1 - 0x12fU < 2) {
        PrefixIncDec(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
        local_28 = (SQParser *)
                   setCoordinates<SQCompilation::Expr>
                             (in_stack_fffffffffffffda0,(Expr *)in_stack_fffffffffffffd98,
                              (SQInteger)in_stack_fffffffffffffd90,
                              (SQInteger)in_stack_fffffffffffffd88);
      }
      else if (lVar1 == 0x133) {
        Lex(in_stack_fffffffffffffda0);
        ClassExp(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
        newNode<SQCompilation::DeclExpr,SQCompilation::Decl*>
                  (in_stack_fffffffffffffdb0,&in_stack_fffffffffffffda8->super_Decl);
        local_28 = (SQParser *)
                   setCoordinates<SQCompilation::DeclExpr>
                             (in_stack_fffffffffffffda0,(DeclExpr *)in_stack_fffffffffffffd98,
                              (SQInteger)in_stack_fffffffffffffd90,
                              (SQInteger)in_stack_fffffffffffffd88);
      }
      else if (lVar1 == 0x136) {
        newNode<SQCompilation::Id,char_const*>
                  (in_stack_fffffffffffffdb0,(char *)in_stack_fffffffffffffda8);
        local_28 = (SQParser *)
                   setCoordinates<SQCompilation::Id>
                             (in_stack_fffffffffffffda0,(Id *)in_stack_fffffffffffffd98,
                              (SQInteger)in_stack_fffffffffffffd90,
                              (SQInteger)in_stack_fffffffffffffd88);
        Lex(in_stack_fffffffffffffda0);
      }
      else if (lVar1 == 0x139) {
        newNode<SQCompilation::LiteralExpr,long>
                  (in_stack_fffffffffffffdb0,(long)in_stack_fffffffffffffda8);
        local_28 = (SQParser *)
                   setCoordinates<SQCompilation::LiteralExpr>
                             (in_stack_fffffffffffffda0,(LiteralExpr *)in_stack_fffffffffffffd98,
                              (SQInteger)in_stack_fffffffffffffd90,
                              (SQInteger)in_stack_fffffffffffffd88);
        Lex(local_28);
      }
      else if (lVar1 == 0x13a) {
        to = newNode<SQCompilation::LiteralExpr,char_const*>
                       (in_stack_fffffffffffffdb0,(char *)in_stack_fffffffffffffda8);
        local_28 = (SQParser *)
                   setCoordinates<SQCompilation::LiteralExpr>
                             (in_stack_fffffffffffffda0,to,(SQInteger)in_stack_fffffffffffffd90,
                              (SQInteger)in_stack_fffffffffffffd88);
        Lex(in_stack_fffffffffffffda0);
      }
      else if (lVar1 - 0x13bU < 2) {
        newNode<SQCompilation::LiteralExpr,bool>
                  (in_stack_fffffffffffffdb0,SUB81((ulong)in_stack_fffffffffffffda8 >> 0x38,0));
        local_28 = (SQParser *)
                   setCoordinates<SQCompilation::LiteralExpr>
                             (in_stack_fffffffffffffda0,(LiteralExpr *)in_stack_fffffffffffffd98,
                              (SQInteger)in_stack_fffffffffffffd90,
                              (SQInteger)in_stack_fffffffffffffd88);
        Lex(in_stack_fffffffffffffda0);
      }
      else if (lVar1 == 0x154) {
        local_28 = (SQParser *)parseStringTemplate(in_stack_ffffffffffffff18);
      }
      else {
        reportDiagnostic(in_RDI,0x19,"expression");
      }
    }
  }
  NestingChecker::~NestingChecker(local_20);
  return (Expr *)local_28;
}

Assistant:

Expr* SQParser::Factor(SQInteger &pos)
{
    NestingChecker nc(this);
    Expr *r = NULL;

    SQInteger l = line(), c = column();

    switch(_token)
    {
    case TK_STRING_LITERAL:
        r = newStringLiteral(_lex._svalue);
        r->setLineStartPos(l); r->setColumnStartPos(c);
        Lex();
        break;
    case TK_TEMPLATE_OP:
        r = parseStringTemplate();
        break;
    case TK_BASE:
        r = setCoordinates(newNode<BaseExpr>(), l, c);
        Lex();
        break;
    case TK_IDENTIFIER:
        r = newId(_lex._svalue);
        r->setLineStartPos(l); r->setColumnStartPos(c);
        Lex();
        break;
    case TK_CONSTRUCTOR:
        r = setCoordinates(newNode<Id>(_SC("constructor")), l, c);
        Lex();
        break;
    case TK_THIS: r = setCoordinates(newNode<Id>(_SC("this")), l, c); Lex(); break;
    case TK_DOUBLE_COLON:  // "::"
        if (_lang_features & LF_FORBID_ROOT_TABLE)
            reportDiagnostic(DiagnosticsId::DI_ROOT_TABLE_FORBIDDEN);
        _token = _SC('.'); /* hack: drop into PrefixExpr, case '.'*/
        r = setCoordinates(newNode<RootTableAccessExpr>(), l, c);
        break;
    case TK_NULL:
        r = setCoordinates(newNode<LiteralExpr>(), l, c);
        Lex();
        break;
    case TK_INTEGER:
        r = setCoordinates(newNode<LiteralExpr>(_lex._nvalue), l, c);
        Lex();
        break;
    case TK_FLOAT:
        r = setCoordinates(newNode<LiteralExpr>(_lex._fvalue), l, c);
        Lex();
        break;
    case TK_TRUE: case TK_FALSE:
        r = setCoordinates(newNode<LiteralExpr>((bool)(_token == TK_TRUE)), l, c);
        Lex();
        break;
    case _SC('['): {
            Lex();
            ArrayExpr *arr = newNode<ArrayExpr>(arena());
            bool commaSeparated = false;
            bool spaceSeparated = false;
            bool reported = false;
            while(_token != _SC(']')) {
                Expr *v = Expression(SQE_ARRAY_ELEM);
                arr->addValue(v);
                if (_token == _SC(',')) {
                    commaSeparated = true;
                }
                else if (_token != _SC(']')) {
                    spaceSeparated = true;
                }

                if (commaSeparated && spaceSeparated && !reported) {
                    reported = true; // do not spam in output, a single diag seems to be enough
                    reportDiagnostic(DiagnosticsId::DI_MIXED_SEPARATORS, "elements of array");
                }

                if (_token == _SC(',')) {
                    Lex();
                }
            }
            setCoordinates(arr, l, c);
            Lex();
            r = arr;
        }
        break;
    case _SC('{'): {
        Lex();
        TableDecl *t = newNode<TableDecl>(arena());
        ParseTableOrClass(t, _SC(','), _SC('}'));
        setCoordinates(t, l, c);
        r = setCoordinates(newNode<DeclExpr>(t), l, c);
        break;
    }
    case TK_FUNCTION:
        r = FunctionExp(false);
        break;
    case _SC('@'):
        r = FunctionExp(true);
        break;
    case TK_CLASS: {
        Lex();
        Decl *classDecl = ClassExp(NULL);
        r = setCoordinates(newNode<DeclExpr>(classDecl), l, c);
        break;
    }
    case _SC('-'):
        Lex();
        switch(_token) {
        case TK_INTEGER:
            r = setCoordinates(newNode<LiteralExpr>(-_lex._nvalue), l, c);
            Lex();
            break;
        case TK_FLOAT:
            r = setCoordinates(newNode<LiteralExpr>(-_lex._fvalue), l, c);
            Lex();
            break;
        default:
            r = setCoordinates(UnaryOP(TO_NEG), l, c);
            break;
        }
        break;
    case _SC('!'):
        Lex();
        r = setCoordinates(UnaryOP(TO_NOT), l, c);
        break;
    case _SC('~'):
        Lex();
        if(_token == TK_INTEGER)  {
            r = setCoordinates(newNode<LiteralExpr>(~_lex._nvalue), l, c);
            Lex();
        }
        else {
            r = setCoordinates(UnaryOP(TO_BNOT), l, c);
        }
        break;
    case TK_TYPEOF : Lex(); r = setCoordinates(UnaryOP(TO_TYPEOF), l, c); break;
    case TK_RESUME : Lex(); r = setCoordinates(UnaryOP(TO_RESUME), l, c); break;
    case TK_CLONE : Lex(); r = setCoordinates(UnaryOP(TO_CLONE), l, c); break;
    case TK_MINUSMINUS :
    case TK_PLUSPLUS :
        r = setCoordinates(PrefixIncDec(_token), l, c);
        break;
    case TK_DELETE :
        if (_lang_features & LF_FORBID_DELETE_OP) {
            reportDiagnostic(DiagnosticsId::DI_DELETE_OP_FORBIDDEN);
        }
        r = DeleteExpr();
        break;
    case _SC('('):
        Lex();
        r = setCoordinates(newNode<UnExpr>(TO_PAREN, Expression(_expression_context)), l, c);
        Expect(_SC(')'));
        break;
    case TK___LINE__:
        r = setCoordinates(newNode<LiteralExpr>(_lex._currentline), l, c);
        Lex();
        break;
    case TK___FILE__:
        r = setCoordinates(newNode<LiteralExpr>(_sourcename), l, c);
        Lex();
        break;
    default:
        reportDiagnostic(DiagnosticsId::DI_EXPECTED_TOKEN, "expression");
    }
    return r;
}